

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void WindowDropCallback(GLFWwindow *window,int count,char **paths)

{
  char *pcVar1;
  ulong __nmemb;
  uint i;
  ulong uVar2;
  uint i_1;
  
  if (0 < count) {
    __nmemb = (ulong)(uint)count;
    if (CORE.Window.dropFileCount != 0) {
      for (uVar2 = 0; uVar2 < CORE.Window.dropFileCount; uVar2 = uVar2 + 1) {
        free(CORE.Window.dropFilepaths[uVar2]);
      }
      free(CORE.Window.dropFilepaths);
    }
    CORE.Window.dropFileCount = count;
    CORE.Window.dropFilepaths = (char **)calloc(__nmemb,8);
    for (uVar2 = 0; uVar2 < __nmemb; uVar2 = uVar2 + 1) {
      pcVar1 = (char *)calloc(0x1000,1);
      CORE.Window.dropFilepaths[uVar2] = pcVar1;
      strcpy(CORE.Window.dropFilepaths[uVar2],paths[uVar2]);
      __nmemb = (ulong)CORE.Window.dropFileCount;
    }
  }
  return;
}

Assistant:

static void WindowDropCallback(GLFWwindow *window, int count, const char **paths)
{
    if (count > 0)
    {
        // In case previous dropped filepaths have not been freed, we free them
        if (CORE.Window.dropFileCount > 0)
        {
            for (unsigned int i = 0; i < CORE.Window.dropFileCount; i++) RL_FREE(CORE.Window.dropFilepaths[i]);

            RL_FREE(CORE.Window.dropFilepaths);

            CORE.Window.dropFileCount = 0;
            CORE.Window.dropFilepaths = NULL;
        }

        // WARNING: Paths are freed by GLFW when the callback returns, we must keep an internal copy
        CORE.Window.dropFileCount = count;
        CORE.Window.dropFilepaths = (char **)RL_CALLOC(CORE.Window.dropFileCount, sizeof(char *));

        for (unsigned int i = 0; i < CORE.Window.dropFileCount; i++)
        {
            CORE.Window.dropFilepaths[i] = (char *)RL_CALLOC(MAX_FILEPATH_LENGTH, sizeof(char));
            strcpy(CORE.Window.dropFilepaths[i], paths[i]);
        }
    }
}